

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring64_bitmap_contains_range(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  leaf_t leaf_00;
  _Bool _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong in_RDX;
  ulong in_RSI;
  uint32_t container_max;
  uint32_t container_min;
  leaf_t leaf;
  uint64_t current_high48_bits;
  uint64_t prev_high48_bits;
  art_iterator_t it;
  uint64_t max_high48_bits;
  uint16_t max_low16;
  uint8_t max_high48 [6];
  uint16_t min_low16;
  uint8_t min_high48 [6];
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  uint8_t in_stack_fffffffffffffeff;
  roaring64_bitmap_t *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  art_t *in_stack_ffffffffffffff10;
  uint local_e8;
  uint local_e4;
  ulong local_d0;
  leaf_t *local_c0;
  _Bool local_1;
  
  if (in_RSI < in_RDX) {
    uVar2 = split_key((uint64_t)in_stack_ffffffffffffff00,
                      (uint8_t *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    uVar3 = split_key((uint64_t)in_stack_ffffffffffffff00,
                      (uint8_t *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    uVar5 = in_RDX - 1 & 0xffffffffffff0000;
    art_lower_bound(in_stack_ffffffffffffff10,
                    (art_key_chunk_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                   );
    if ((local_c0 == (leaf_t *)0x0) ||
       (uVar6 = combine_key((uint8_t *)in_stack_ffffffffffffff00,
                            CONCAT11(in_stack_fffffffffffffeff,in_stack_fffffffffffffefe)),
       in_RSI < uVar6)) {
      local_1 = false;
    }
    else {
      local_d0 = in_RSI & 0xffffffffffff0000;
      while (local_c0 != (leaf_t *)0x0) {
        uVar6 = combine_key((uint8_t *)in_stack_ffffffffffffff00,
                            CONCAT11(in_stack_fffffffffffffeff,in_stack_fffffffffffffefe));
        if (uVar5 < uVar6) {
          return true;
        }
        if (0x10000 < uVar6 - local_d0) {
          return false;
        }
        leaf_00 = *local_c0;
        local_e4 = 0;
        iVar4 = compare_high48((art_key_chunk_t *)in_stack_ffffffffffffff00,
                               (art_key_chunk_t *)
                               CONCAT17(in_stack_fffffffffffffeff,
                                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8
                                                )));
        if (iVar4 == 0) {
          local_e4 = (uint)uVar2;
        }
        local_e8 = 0x10000;
        iVar4 = compare_high48((art_key_chunk_t *)in_stack_ffffffffffffff00,
                               (art_key_chunk_t *)
                               CONCAT17(in_stack_fffffffffffffeff,
                                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8
                                                )));
        if (iVar4 == 0) {
          local_e8 = (uint)uVar3;
        }
        if ((local_e4 == 0) && (local_e8 == 0x10000)) {
          get_container(in_stack_ffffffffffffff00,
                        CONCAT17(in_stack_fffffffffffffeff,
                                 CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
          get_typecode(leaf_00);
          _Var1 = container_is_full((container_t *)
                                    CONCAT17(in_stack_fffffffffffffeff,
                                             CONCAT16(in_stack_fffffffffffffefe,
                                                      in_stack_fffffffffffffef8)),'\0');
          if (!_Var1) {
            return false;
          }
        }
        else {
          in_stack_ffffffffffffff00 =
               (roaring64_bitmap_t *)
               get_container(in_stack_ffffffffffffff00,
                             CONCAT17(in_stack_fffffffffffffeff,
                                      CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8))
                            );
          get_typecode(leaf_00);
          _Var1 = container_contains_range
                            ((container_t *)CONCAT44(local_e8,local_e4),
                             (uint32_t)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                             (uint32_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
          if (!_Var1) {
            return false;
          }
        }
        art_iterator_next((art_iterator_t *)0x140261);
        local_d0 = uVar6;
      }
      local_1 = local_d0 == uVar5;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool roaring64_bitmap_contains_range(const roaring64_bitmap_t *r, uint64_t min,
                                     uint64_t max) {
    if (min >= max) {
        return true;
    }

    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);
    uint64_t max_high48_bits = (max - 1) & 0xFFFFFFFFFFFF0000;  // Inclusive

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    if (it.value == NULL || combine_key(it.key, 0) > min) {
        return false;
    }
    uint64_t prev_high48_bits = min & 0xFFFFFFFFFFFF0000;
    while (it.value != NULL) {
        uint64_t current_high48_bits = combine_key(it.key, 0);
        if (current_high48_bits > max_high48_bits) {
            // We've passed the end of the range with all containers containing
            // the range.
            return true;
        }
        if (current_high48_bits - prev_high48_bits > 0x10000) {
            // There is a gap in the iterator that falls in the range.
            return false;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint32_t container_min = 0;
        if (compare_high48(it.key, min_high48) == 0) {
            container_min = min_low16;
        }
        uint32_t container_max = 0xFFFF + 1;  // Exclusive
        if (compare_high48(it.key, max_high48) == 0) {
            container_max = max_low16;
        }

        // For the first and last containers we use container_contains_range,
        // for the intermediate containers we can use container_is_full.
        if (container_min == 0 && container_max == 0xFFFF + 1) {
            if (!container_is_full(get_container(r, leaf),
                                   get_typecode(leaf))) {
                return false;
            }
        } else if (!container_contains_range(get_container(r, leaf),
                                             container_min, container_max,
                                             get_typecode(leaf))) {
            return false;
        }
        prev_high48_bits = current_high48_bits;
        art_iterator_next(&it);
    }
    return prev_high48_bits == max_high48_bits;
}